

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint amount)

{
  uint local_18;
  uint i;
  uint amount_local;
  TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this_local;
  
  if (this->Count < amount) {
    Grow(this,amount - this->Count);
    for (local_18 = this->Count; local_18 < amount; local_18 = local_18 + 1) {
      ACSStringPool::PoolEntry::PoolEntry(this->Array + local_18);
    }
  }
  else if (this->Count != amount) {
    DoDelete(this,amount,this->Count - 1);
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}